

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address_tests.cpp
# Opt level: O0

void __thiscall IpAddressTests_Decrement_Test::TestBody(IpAddressTests_Decrement_Test *this)

{
  bool bVar1;
  ostream *this_00;
  reference lhs;
  char *message;
  AssertHelper local_58;
  Message local_50 [3];
  int local_38 [2];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  int local_18;
  address local_14;
  int i;
  address addr;
  IpAddressTests_Decrement_Test *this_local;
  
  _i = this;
  ip::address::address(&local_14,0xc6,'\x01','\x01','\v');
  for (local_18 = 0; local_18 < 0xb; local_18 = local_18 + 1) {
    gtest_ar.message_.ptr_._4_4_ = (_Type)ip::address::operator--(&local_14,0);
  }
  this_00 = ip::operator<<((ostream *)&std::cout,&local_14);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_38[1] = 3;
  lhs = ip::address::operator[](&local_14,local_38 + 1);
  local_38[0] = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_char,int>
            ((EqHelper<false> *)local_30,"addr[3]","0",lhs,local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(IpAddressTests, Decrement)
{
    ip::address addr = { 198, 1, 1, 11 };

    for(int i = 0; i < 11; i++)
    {
        addr--;
    }

    std::cout << addr << std::endl;

    ASSERT_EQ(addr[3], 0);
}